

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  lua_State *plVar1;
  long *in_RCX;
  long *in_RSI;
  lua_State *in_RDI;
  TValue *o1_1;
  TValue *o2_1;
  TValue *o1;
  TValue *o2;
  TValue *oldval;
  Table *h;
  TValue *tm;
  TValue temp;
  int loop;
  TString *in_stack_ffffffffffffff78;
  lua_State *in_stack_ffffffffffffff80;
  lua_State *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  lua_State *in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  TValue *in_stack_ffffffffffffffb0;
  Table *in_stack_ffffffffffffffb8;
  GCObject *in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  lua_State *in_stack_ffffffffffffffd0;
  int local_24;
  long *local_10;
  
  local_24 = 0;
  local_10 = in_RSI;
  do {
    if (99 < local_24) {
      luaG_runerror(in_RDI,"loop in settable");
      return;
    }
    if ((int)local_10[1] == 5) {
      in_stack_ffffffffffffffb8 = (Table *)*local_10;
      in_stack_ffffffffffffffb0 =
           luaH_set(in_stack_ffffffffffffff88,(Table *)in_stack_ffffffffffffff80,
                    (TValue *)&in_stack_ffffffffffffff78->tsv);
      if (in_stack_ffffffffffffffb0->tt != 0) {
LAB_0010abb0:
        (in_stack_ffffffffffffffb0->value).gc = (GCObject *)*in_RCX;
        in_stack_ffffffffffffffb0->tt = (int)in_RCX[1];
        in_stack_ffffffffffffffb8->flags = '\0';
        if ((int)in_RCX[1] < 4) {
          return;
        }
        if ((*(byte *)(*in_RCX + 9) & 3) == 0) {
          return;
        }
        if ((in_stack_ffffffffffffffb8->marked & 4) == 0) {
          return;
        }
        luaC_barrierback(in_RDI,in_stack_ffffffffffffffb8);
        return;
      }
      if (in_stack_ffffffffffffffb8->metatable == (Table *)0x0) {
        in_stack_ffffffffffffff88 = (lua_State *)0x0;
      }
      else if ((in_stack_ffffffffffffffb8->metatable->flags & 2) == 0) {
        in_stack_ffffffffffffff80 =
             (lua_State *)
             luaT_gettm((Table *)in_stack_ffffffffffffff88,
                        (TMS)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff80;
      }
      else {
        in_stack_ffffffffffffff80 = (lua_State *)0x0;
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff80;
      }
      plVar1 = in_stack_ffffffffffffff88;
      if (in_stack_ffffffffffffff88 == (lua_State *)0x0) goto LAB_0010abb0;
    }
    else {
      plVar1 = (lua_State *)
               luaT_gettmbyobj(in_stack_ffffffffffffffa0,(TValue *)in_stack_ffffffffffffff98,
                               (TMS)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      if (*(int *)&plVar1->tt == 0) {
        luaG_typeerror(in_stack_ffffffffffffffa0,(TValue *)in_stack_ffffffffffffff98,
                       in_stack_ffffffffffffff90);
      }
    }
    in_stack_ffffffffffffff98 = plVar1;
    if (*(int *)&in_stack_ffffffffffffff98->tt == 6) {
      callTM(in_stack_ffffffffffffffd0,(TValue *)&in_stack_ffffffffffffffc8->gch,
             (TValue *)in_stack_ffffffffffffff98,(TValue *)in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
      return;
    }
    in_stack_ffffffffffffff90 = &stack0xffffffffffffffc8;
    in_stack_ffffffffffffffc8 = in_stack_ffffffffffffff98->next;
    uVar2 = *(undefined4 *)&in_stack_ffffffffffffff98->tt;
    local_10 = (long *)&stack0xffffffffffffffc8;
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static void luaV_settable(lua_State*L,const TValue*t,TValue*key,StkId val){
int loop;
TValue temp;
for(loop=0;loop<100;loop++){
const TValue*tm;
if(ttistable(t)){
Table*h=hvalue(t);
TValue*oldval=luaH_set(L,h,key);
if(!ttisnil(oldval)||
(tm=fasttm(L,h->metatable,TM_NEWINDEX))==NULL){
setobj(L,oldval,val);
h->flags=0;
luaC_barriert(L,h,val);
return;
}
}
else if(ttisnil(tm=luaT_gettmbyobj(L,t,TM_NEWINDEX)))
luaG_typeerror(L,t,"index");
if(ttisfunction(tm)){
callTM(L,tm,t,key,val);
return;
}
setobj(L,&temp,tm);
t=&temp;
}
luaG_runerror(L,"loop in settable");
}